

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineState.h
# Opt level: O3

void __thiscall
Diligent::GraphicsPipelineStateCreateInfo::GraphicsPipelineStateCreateInfo
          (GraphicsPipelineStateCreateInfo *this)

{
  long lVar1;
  
  lVar1 = 0;
  (this->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name = (Char *)0x0;
  (this->super_PipelineStateCreateInfo).PSODesc.PipelineType = PIPELINE_TYPE_GRAPHICS;
  (this->super_PipelineStateCreateInfo).PSODesc.SRBAllocationGranularity = 1;
  (this->super_PipelineStateCreateInfo).PSODesc.ImmediateContextMask = 1;
  (this->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableType =
       SHADER_RESOURCE_VARIABLE_TYPE_STATIC;
  (this->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableMergeStages =
       SHADER_TYPE_UNKNOWN;
  (this->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.NumVariables = 0;
  (this->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.Variables =
       (ShaderResourceVariableDesc *)0x0;
  (this->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.NumImmutableSamplers = 0;
  (this->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.ImmutableSamplers =
       (ImmutableSamplerDesc *)0x0;
  (this->super_PipelineStateCreateInfo).Flags = PSO_CREATE_FLAG_NONE;
  (this->super_PipelineStateCreateInfo).ResourceSignaturesCount = 0;
  (this->super_PipelineStateCreateInfo).ppResourceSignatures = (IPipelineResourceSignature **)0x0;
  (this->super_PipelineStateCreateInfo).pPSOCache = (IPipelineStateCache *)0x0;
  *(undefined8 *)((long)&(this->super_PipelineStateCreateInfo).pPSOCache + 2) = 0;
  *(undefined8 *)((long)&(this->super_PipelineStateCreateInfo).pInternalData + 2) = 0;
  do {
    *(undefined8 *)(&(this->GraphicsPipeline).BlendDesc.RenderTargets[0].BlendEnable + lVar1) =
         0x101020101020000;
    *(undefined2 *)(&(this->GraphicsPipeline).BlendDesc.RenderTargets[0].LogicOp + lVar1) = 0xf04;
    lVar1 = lVar1 + 10;
  } while (lVar1 != 0x50);
  (this->GraphicsPipeline).SampleMask = 0xffffffff;
  (this->GraphicsPipeline).RasterizerDesc.FillMode = FILL_MODE_SOLID;
  (this->GraphicsPipeline).RasterizerDesc.CullMode = CULL_MODE_BACK;
  (this->GraphicsPipeline).RasterizerDesc.FrontCounterClockwise = false;
  (this->GraphicsPipeline).RasterizerDesc.DepthClipEnable = true;
  (this->GraphicsPipeline).RasterizerDesc.ScissorEnable = false;
  (this->GraphicsPipeline).RasterizerDesc.AntialiasedLineEnable = false;
  (this->GraphicsPipeline).RasterizerDesc.DepthBias = 0;
  (this->GraphicsPipeline).RasterizerDesc.DepthBiasClamp = 0.0;
  (this->GraphicsPipeline).RasterizerDesc.SlopeScaledDepthBias = 0.0;
  (this->GraphicsPipeline).DepthStencilDesc.DepthEnable = true;
  (this->GraphicsPipeline).DepthStencilDesc.DepthWriteEnable = true;
  (this->GraphicsPipeline).DepthStencilDesc.DepthFunc = COMPARISON_FUNC_LESS;
  (this->GraphicsPipeline).DepthStencilDesc.StencilEnable = false;
  (this->GraphicsPipeline).DepthStencilDesc.StencilReadMask = 0xff;
  (this->GraphicsPipeline).DepthStencilDesc.StencilWriteMask = 0xff;
  (this->GraphicsPipeline).DepthStencilDesc.FrontFace.StencilFailOp = STENCIL_OP_KEEP;
  (this->GraphicsPipeline).DepthStencilDesc.FrontFace.StencilDepthFailOp = STENCIL_OP_KEEP;
  *(undefined4 *)&(this->GraphicsPipeline).DepthStencilDesc.FrontFace.StencilPassOp = 0x1010801;
  (this->GraphicsPipeline).DepthStencilDesc.BackFace.StencilPassOp = STENCIL_OP_KEEP;
  (this->GraphicsPipeline).DepthStencilDesc.BackFace.StencilFunc = COMPARISON_FUNC_ALWAYS;
  (this->GraphicsPipeline).InputLayout.LayoutElements = (LayoutElement *)0x0;
  (this->GraphicsPipeline).InputLayout.NumElements = 0;
  (this->GraphicsPipeline).PrimitiveTopology = PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  (this->GraphicsPipeline).NumViewports = '\x01';
  (this->GraphicsPipeline).NumRenderTargets = '\0';
  (this->GraphicsPipeline).SubpassIndex = '\0';
  (this->GraphicsPipeline).ShadingRateFlags = PIPELINE_SHADING_RATE_FLAG_NONE;
  (this->GraphicsPipeline).RTVFormats[0] = TEX_FORMAT_UNKNOWN;
  (this->GraphicsPipeline).RTVFormats[1] = TEX_FORMAT_UNKNOWN;
  (this->GraphicsPipeline).RTVFormats[2] = TEX_FORMAT_UNKNOWN;
  (this->GraphicsPipeline).RTVFormats[3] = TEX_FORMAT_UNKNOWN;
  (this->GraphicsPipeline).RTVFormats[4] = TEX_FORMAT_UNKNOWN;
  (this->GraphicsPipeline).RTVFormats[5] = TEX_FORMAT_UNKNOWN;
  (this->GraphicsPipeline).RTVFormats[6] = TEX_FORMAT_UNKNOWN;
  (this->GraphicsPipeline).RTVFormats[7] = TEX_FORMAT_UNKNOWN;
  *(undefined4 *)((long)(this->GraphicsPipeline).RTVFormats + 0xf) = 0;
  (this->GraphicsPipeline).SmplDesc.Count = '\x01';
  (this->GraphicsPipeline).SmplDesc.Quality = '\0';
  (this->GraphicsPipeline).pRenderPass = (IRenderPass *)0x0;
  (this->GraphicsPipeline).NodeMask = 0;
  (this->super_PipelineStateCreateInfo).PSODesc.PipelineType = PIPELINE_TYPE_GRAPHICS;
  this->pVS = (IShader *)0x0;
  this->pPS = (IShader *)0x0;
  this->pDS = (IShader *)0x0;
  this->pHS = (IShader *)0x0;
  this->pGS = (IShader *)0x0;
  this->pAS = (IShader *)0x0;
  this->pMS = (IShader *)0x0;
  return;
}

Assistant:

constexpr GraphicsPipelineStateCreateInfo() noexcept 
    {
        PSODesc.PipelineType = PIPELINE_TYPE_GRAPHICS;
    }